

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int mixed_make_segment_quantize(uint32_t steps,mixed_segment *segment)

{
  void *pvVar1;
  quantize_segment_data *data;
  mixed_segment *segment_local;
  uint32_t steps_local;
  
  pvVar1 = (*mixed_calloc)(1,0x18);
  if (pvVar1 != (void *)0x0) {
    *(float *)((long)pvVar1 + 0x10) = (float)steps;
    *(undefined4 *)((long)pvVar1 + 0x14) = 0x3f800000;
    segment->free = quantize_segment_free;
    segment->start = quantize_segment_start;
    segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001050b0;
    segment->set_in = quantize_segment_set_in;
    segment->set_out = quantize_segment_set_out;
    segment->info = quantize_segment_info;
    segment->get = quantize_segment_get;
    segment->set = quantize_segment_set;
    segment->data = pvVar1;
  }
  else {
    mixed_err(1);
  }
  segment_local._4_4_ = (uint)(pvVar1 != (void *)0x0);
  return segment_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_quantize(uint32_t steps, struct mixed_segment *segment){
  struct quantize_segment_data *data = mixed_calloc(1, sizeof(struct quantize_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->steps = steps;
  data->mix = 1.0;
  segment->free = quantize_segment_free;
  segment->start = quantize_segment_start;
  segment->mix = quantize_segment_mix;
  segment->set_in = quantize_segment_set_in;
  segment->set_out = quantize_segment_set_out;
  segment->info = quantize_segment_info;
  segment->get = quantize_segment_get;
  segment->set = quantize_segment_set;
  segment->data = data;
  return 1;
}